

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O1

void uo_cb_prepend_cb(uo_cb *cb,uo_cb *cb_before)

{
  void **__src;
  size_t sVar1;
  uo_linklist *puVar2;
  uo_linklist *puVar3;
  uo_linklist *puVar4;
  void **ppvVar5;
  ulong uVar6;
  ulong uVar7;
  uo_linklist *puVar8;
  long in_FS_OFFSET;
  
  __src = (cb_before->stack).items;
  sVar1 = (cb_before->stack).count;
  uVar7 = (cb->stack).count + sVar1;
  if ((cb->stack).capacity < uVar7) {
    uVar6 = uVar7 - 1 >> 1 | uVar7 - 1;
    uVar6 = uVar6 >> 2 | uVar6;
    uVar6 = uVar6 >> 4 | uVar6;
    uVar6 = uVar6 >> 8 | uVar6;
    uVar6 = uVar6 >> 0x10 | uVar6;
    uVar6 = uVar6 >> 0x20 | uVar6;
    (cb->stack).capacity = uVar6 + 1;
    ppvVar5 = (void **)realloc((cb->stack).items,uVar6 * 8 + 8);
    (cb->stack).items = ppvVar5;
  }
  memcpy((cb->stack).items + (cb->stack).count,__src,sVar1 << 3);
  (cb->stack).count = uVar7;
  for (puVar8 = (cb_before->funclist).prev; puVar8 != &cb_before->funclist; puVar8 = puVar8->prev) {
    puVar2 = puVar8[1].next;
    uo_cb_func_linkpool_grow(0x20);
    puVar3 = *(uo_linklist **)(in_FS_OFFSET + -0x20);
    puVar4 = puVar3->next;
    puVar4->prev = puVar3->prev;
    puVar3->prev->next = puVar4;
    puVar3->next = (uo_linklist *)0x0;
    puVar3->prev = (uo_linklist *)0x0;
    puVar3[1].next = puVar2;
    puVar2 = (cb->funclist).next;
    puVar4 = puVar2->prev;
    puVar3->prev = puVar4;
    puVar4->next = puVar3;
    puVar3->next = puVar2;
    puVar2->prev = puVar3;
  }
  return;
}

Assistant:

void uo_cb_prepend_cb(
    uo_cb *cb,
    uo_cb *cb_before)
{
    uo_stack_push_arr(&cb->stack, cb_before->stack.items, cb_before->stack.count);

    uo_linklist *link = cb_before->funclist.prev;

    while (link != &cb_before->funclist)
    {
        uo_cb_prepend_func(cb, ((uo_cb_func_linklist *)link)->item);
        link = link->prev;
    }
}